

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O0

int yy_primary(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int yythunkpos68;
  int yypos68;
  int yythunkpos61;
  int yypos61;
  int yythunkpos59;
  int yypos59;
  int yythunkpos57;
  int yypos57;
  int yythunkpos0;
  int yypos0;
  GREG *G_local;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  iVar7 = G->pos;
  iVar3 = G->thunkpos;
  iVar5 = yy_identifier(G);
  if (iVar5 != 0) {
    yyDo(G,yy_1_primary,G->begin,G->end,"yy_1_primary");
    iVar5 = yy_COLON(G);
    if ((iVar5 != 0) && (iVar5 = yy_identifier(G), iVar5 != 0)) {
      iVar5 = G->pos;
      iVar4 = G->thunkpos;
      iVar6 = yy_EQUAL(G);
      if (iVar6 == 0) {
        G->pos = iVar5;
        G->thunkpos = iVar4;
        yyDo(G,yy_2_primary,G->begin,G->end,"yy_2_primary");
        goto LAB_00104e30;
      }
    }
  }
  G->pos = iVar7;
  G->thunkpos = iVar3;
  iVar5 = yy_identifier(G);
  if (iVar5 != 0) {
    iVar5 = G->pos;
    iVar4 = G->thunkpos;
    iVar6 = yy_EQUAL(G);
    if (iVar6 == 0) {
      G->pos = iVar5;
      G->thunkpos = iVar4;
      yyDo(G,yy_3_primary,G->begin,G->end,"yy_3_primary");
      goto LAB_00104e30;
    }
  }
  G->pos = iVar7;
  G->thunkpos = iVar3;
  iVar5 = yy_OPEN(G);
  if (((iVar5 == 0) || (iVar5 = yy_expression(G), iVar5 == 0)) || (iVar5 = yy_CLOSE(G), iVar5 == 0))
  {
    G->pos = iVar7;
    G->thunkpos = iVar3;
    iVar5 = yy_literal(G);
    if (iVar5 == 0) {
      G->pos = iVar7;
      G->thunkpos = iVar3;
      iVar5 = yy_class(G);
      if (iVar5 == 0) {
        G->pos = iVar7;
        G->thunkpos = iVar3;
        iVar5 = yy_DOT(G);
        if (iVar5 == 0) {
          G->pos = iVar7;
          G->thunkpos = iVar3;
          iVar5 = yy_action(G);
          if (iVar5 == 0) {
            G->pos = iVar7;
            G->thunkpos = iVar3;
            iVar5 = yy_BEGIN(G);
            if (iVar5 == 0) {
              G->pos = iVar7;
              G->thunkpos = iVar3;
              iVar7 = yy_END(G);
              if (iVar7 == 0) {
                G->pos = iVar1;
                G->thunkpos = iVar2;
                return 0;
              }
              yyDo(G,yy_9_primary,G->begin,G->end,"yy_9_primary");
            }
            else {
              yyDo(G,yy_8_primary,G->begin,G->end,"yy_8_primary");
            }
          }
          else {
            yyDo(G,yy_7_primary,G->begin,G->end,"yy_7_primary");
          }
        }
        else {
          yyDo(G,yy_6_primary,G->begin,G->end,"yy_6_primary");
        }
      }
      else {
        yyDo(G,yy_5_primary,G->begin,G->end,"yy_5_primary");
      }
    }
    else {
      yyDo(G,yy_4_primary,G->begin,G->end,"yy_4_primary");
    }
  }
LAB_00104e30:
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  iVar7 = yy_errblock(G);
  if (iVar7 == 0) {
    G->pos = iVar1;
    G->thunkpos = iVar2;
  }
  else {
    yyDo(G,yy_10_primary,G->begin,G->end,"yy_10_primary");
  }
  return 1;
}

Assistant:

YY_RULE(int) yy_primary(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyprintfv((stderr, "%s\n", "primary"));

  {  int yypos57= G->pos, yythunkpos57= G->thunkpos;  if (!yy_identifier(G))  goto l58;
  yyDo(G, yy_1_primary, G->begin, G->end, "yy_1_primary");
  if (!yy_COLON(G))  goto l58;
  if (!yy_identifier(G))  goto l58;

  {  int yypos59= G->pos, yythunkpos59= G->thunkpos;  if (!yy_EQUAL(G))  goto l59;
  goto l58;
  l59:;	  G->pos= yypos59; G->thunkpos= yythunkpos59;
  }  yyDo(G, yy_2_primary, G->begin, G->end, "yy_2_primary");
  goto l57;
  l58:;	  G->pos= yypos57; G->thunkpos= yythunkpos57;  if (!yy_identifier(G))  goto l60;

  {  int yypos61= G->pos, yythunkpos61= G->thunkpos;  if (!yy_EQUAL(G))  goto l61;
  goto l60;
  l61:;	  G->pos= yypos61; G->thunkpos= yythunkpos61;
  }  yyDo(G, yy_3_primary, G->begin, G->end, "yy_3_primary");
  goto l57;
  l60:;	  G->pos= yypos57; G->thunkpos= yythunkpos57;  if (!yy_OPEN(G))  goto l62;
  if (!yy_expression(G))  goto l62;
  if (!yy_CLOSE(G))  goto l62;
  goto l57;
  l62:;	  G->pos= yypos57; G->thunkpos= yythunkpos57;  if (!yy_literal(G))  goto l63;
  yyDo(G, yy_4_primary, G->begin, G->end, "yy_4_primary");
  goto l57;
  l63:;	  G->pos= yypos57; G->thunkpos= yythunkpos57;  if (!yy_class(G))  goto l64;
  yyDo(G, yy_5_primary, G->begin, G->end, "yy_5_primary");
  goto l57;
  l64:;	  G->pos= yypos57; G->thunkpos= yythunkpos57;  if (!yy_DOT(G))  goto l65;
  yyDo(G, yy_6_primary, G->begin, G->end, "yy_6_primary");
  goto l57;
  l65:;	  G->pos= yypos57; G->thunkpos= yythunkpos57;  if (!yy_action(G))  goto l66;
  yyDo(G, yy_7_primary, G->begin, G->end, "yy_7_primary");
  goto l57;
  l66:;	  G->pos= yypos57; G->thunkpos= yythunkpos57;  if (!yy_BEGIN(G))  goto l67;
  yyDo(G, yy_8_primary, G->begin, G->end, "yy_8_primary");
  goto l57;
  l67:;	  G->pos= yypos57; G->thunkpos= yythunkpos57;  if (!yy_END(G))  goto l56;
  yyDo(G, yy_9_primary, G->begin, G->end, "yy_9_primary");

  }
  l57:;	
  {  int yypos68= G->pos, yythunkpos68= G->thunkpos;  if (!yy_errblock(G))  goto l68;
  yyDo(G, yy_10_primary, G->begin, G->end, "yy_10_primary");
  goto l69;
  l68:;	  G->pos= yypos68; G->thunkpos= yythunkpos68;
  }
  l69:;	  yyprintf((stderr, "  ok   primary"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));

  return 1;
  l56:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "primary"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}